

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covscript.cpp
# Opt level: O1

void __thiscall cs::exception::relocate_to_csym(exception *this,csym_info *csym)

{
  pointer puVar1;
  ulong line;
  pointer pbVar2;
  fatal_error *pfVar3;
  string local_38;
  
  puVar1 = (csym->map).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)((long)(csym->map).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3) <= this->mLine) {
    pfVar3 = (fatal_error *)__cxa_allocate_exception(0x28);
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"Invalid line when relocating symbols in cSYM.","");
    fatal_error::fatal_error(pfVar3,&local_38);
    __cxa_throw(pfVar3,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  line = puVar1[this->mLine - 1];
  pbVar2 = (csym->codes).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (line < (ulong)((long)(csym->codes).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5)) {
    if (line == 0) {
      compose_what_internal(&local_38,&csym->file,&this->mWhat);
    }
    else {
      compose_what(&local_38,&csym->file,line,pbVar2 + (line - 1),&this->mWhat);
    }
    std::__cxx11::string::operator=((string *)&this->mStr,(string *)&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  pfVar3 = (fatal_error *)__cxa_allocate_exception(0x28);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"Broken cSYM file.","");
  fatal_error::fatal_error(pfVar3,&local_38);
  __cxa_throw(pfVar3,&fatal_error::typeinfo,fatal_error::~fatal_error);
}

Assistant:

void exception::relocate_to_csym(const csym_info &csym)
	{
		if (mLine >= csym.map.size())
			throw fatal_error("Invalid line when relocating symbols in cSYM.");
		std::size_t relocated_line = csym.map[mLine - 1];
		if (relocated_line >= csym.codes.size())
			throw fatal_error("Broken cSYM file.");
		if (relocated_line > 0) {
			const std::string &relocated_code = csym.codes[relocated_line - 1];
			mStr = compose_what(csym.file, relocated_line, relocated_code, mWhat);
		}
		else
			mStr = compose_what_internal(csym.file, mWhat);
	}